

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O1

void __thiscall Maze::printSolved(Maze *this)

{
  Maze *this_00;
  
  if (this->isSolved == true) {
    this_00 = (Maze *)&stack0xffffffffffffffe0;
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffffe0,&this->solvedMatrix);
    printMatrix(this_00,(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         *)&stack0xffffffffffffffe0);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffffe0);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not Solved",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return;
}

Assistant:

void Maze::printSolved() {
    //prints the maze that is solved.
    if(isSolved){
        printMatrix(solvedMatrix);
    }
    else{
        std::cout <<"Not Solved"<<std::endl;
    }
}